

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O3

bool __thiscall Js::JavascriptPromise::WillRejectionBeUnhandled(JavascriptPromise *this)

{
  SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *pSVar1;
  JavascriptPromiseReaction *pJVar2;
  Var aValue;
  RecyclableObject *obj;
  FunctionInfo *pFVar3;
  code *pcVar4;
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  JavascriptPromise *pJVar8;
  Type *pTVar9;
  JavascriptFunction *pJVar10;
  EntryType *pEVar11;
  byte bVar12;
  undefined1 local_c8 [8];
  SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
  visited;
  undefined1 local_88 [8];
  Stack<Js::JavascriptPromise_*,_Memory::HeapAllocator,_false,_DefaultComparer> stack;
  SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *local_50;
  Type local_48;
  undefined4 *local_40;
  byte local_32;
  byte local_31;
  
  local_31 = this->isHandled;
  bVar12 = 1;
  if ((Type)local_31 == true) {
    stack.list.super_ReadOnlyList<Js::JavascriptPromise_*,_Memory::HeapAllocator,_DefaultComparer>.
    _16_8_ = &Memory::HeapAllocator::Instance;
    visited.stats = (DictionaryStats *)&PTR_IsReadOnly_0152f030;
    local_88 = (undefined1  [8])&PTR_IsReadOnly_0152f030;
    stack.list.super_ReadOnlyList<Js::JavascriptPromise_*,_Memory::HeapAllocator,_DefaultComparer>.
    _vptr_ReadOnlyList = (_func_int **)0x0;
    stack.list.super_ReadOnlyList<Js::JavascriptPromise_*,_Memory::HeapAllocator,_DefaultComparer>.
    buffer._0_4_ = 0;
    stack.list.super_ReadOnlyList<Js::JavascriptPromise_*,_Memory::HeapAllocator,_DefaultComparer>.
    alloc = (Type)0x400000000;
    local_c8 = (undefined1  [8])&Memory::HeapAllocator::Instance;
    visited.free = (EntryType *)0x4000000000;
    visited.count = 0;
    visited.freecount = 0x4b;
    SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
    ::Initialize((SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
                  *)local_c8);
    JsUtil::
    List<Js::JavascriptPromise_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::EnsureArray((List<Js::JavascriptPromise_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                   *)local_88,0);
    stack.list.super_ReadOnlyList<Js::JavascriptPromise_*,_Memory::HeapAllocator,_DefaultComparer>.
    _vptr_ReadOnlyList
    [(int)stack.list.
          super_ReadOnlyList<Js::JavascriptPromise_*,_Memory::HeapAllocator,_DefaultComparer>.buffer
    ] = (_func_int *)this;
    stack.list.super_ReadOnlyList<Js::JavascriptPromise_*,_Memory::HeapAllocator,_DefaultComparer>.
    buffer._0_4_ = (int)stack.list.
                        super_ReadOnlyList<Js::JavascriptPromise_*,_Memory::HeapAllocator,_DefaultComparer>
                        .buffer + 1;
    SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
    ::Add((SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
           *)local_c8,this,1);
    bVar12 = local_31 == 0;
    if ((!(bool)bVar12) &&
       ((int)stack.list.
             super_ReadOnlyList<Js::JavascriptPromise_*,_Memory::HeapAllocator,_DefaultComparer>.
             buffer != 0)) {
      local_40 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      local_32 = local_31 ^ 1;
      do {
        pJVar8 = JsUtil::
                 Stack<Js::JavascriptPromise_*,_Memory::HeapAllocator,_false,_DefaultComparer>::Pop
                           ((Stack<Js::JavascriptPromise_*,_Memory::HeapAllocator,_false,_DefaultComparer>
                             *)local_88);
        stack.list._40_8_ = (pJVar8->reactions).ptr;
        local_50 = (SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)
                   stack.list._40_8_;
        while( true ) {
          if (local_50 ==
              (SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *local_40 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                        ,0x76,"(current != nullptr)","current != nullptr");
            if (!bVar6) goto LAB_00cf0b1a;
            *local_40 = 0;
          }
          uVar5 = stack.list._40_8_;
          pSVar1 = (SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)
                   (local_50->
                   super_SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>).
                   super_SListNodeBase<Memory::Recycler>.next.ptr;
          Memory::Recycler::WBSetBit((char *)&local_48);
          local_48.ptr = (SListNodeBase<Memory::Recycler> *)pSVar1;
          Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_48);
          if (local_48.ptr == (SListNodeBase<Memory::Recycler> *)uVar5) break;
          pSVar1 = (SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)
                   (local_50->
                   super_SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>).
                   super_SListNodeBase<Memory::Recycler>.next.ptr;
          Memory::Recycler::WBSetBit((char *)&local_48);
          local_48.ptr = (SListNodeBase<Memory::Recycler> *)pSVar1;
          Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_48);
          local_50 = (SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)
                     local_48.ptr;
          pTVar9 = SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>::
                   Iterator::Data((Iterator *)&stack.list.field_0x28);
          pJVar2 = pTVar9->rejectReaction;
          aValue = (((pJVar2->capabilities).ptr)->promise).ptr;
          bVar6 = VarIs<Js::JavascriptPromise>(aValue);
          if (bVar6) {
            pJVar8 = VarTo<Js::JavascriptPromise>(aValue);
            if (pJVar8->isHandled == false) {
              obj = (pJVar2->handler).ptr;
              bVar6 = VarIsImpl<Js::JavascriptFunction>(obj);
              if (bVar6) {
                pJVar10 = VarTo<Js::JavascriptFunction,Js::RecyclableObject>(obj);
                pFVar3 = (pJVar10->functionInfo).ptr;
                iVar7 = (*(pJVar10->super_DynamicObject).super_RecyclableObject.
                          super_FinalizableObject.super_IRecyclerVisitedObject.
                          _vptr_IRecyclerVisitedObject[0x66])(pJVar10);
                if ((iVar7 == 0) &&
                   ((((((((((((pJVar10->super_DynamicObject).super_RecyclableObject.type.ptr)->
                            javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)
                        ->super_ScriptContextBase).javascriptLibrary)->throwerFunction).ptr)->
                    functionInfo).ptr != (FunctionInfo *)EntryInfo::Thrower)) {
                  AssertCount = AssertCount + 1;
                  Throw::LogAssert();
                  *local_40 = 1;
                  bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                              ,0x541,
                                              "(func->GetScriptContext()->GetLibrary()->GetThrowerFunction()->GetFunctionInfo() == &JavascriptPromise::EntryInfo::Thrower)"
                                              ,"unexpected FunctionInfo for thrower function!");
                  if (!bVar6) goto LAB_00cf0b1a;
                  *local_40 = 0;
                }
                if (pFVar3 == (FunctionInfo *)EntryInfo::Thrower) {
                  bVar12 = 1;
                  goto LAB_00cf0ad4;
                }
              }
            }
            pEVar11 = SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
                      ::FindEntry((SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
                                   *)local_c8,pJVar8);
            if (pEVar11 != (EntryType *)0x0) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *local_40 = 1;
              bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                          ,0x54e,"(visited.HasEntry(p) == false)",
                                          "Unexpected cycle in promise reaction tree!");
              if (!bVar6) {
LAB_00cf0b1a:
                pcVar4 = (code *)invalidInstructionException();
                (*pcVar4)();
              }
              *local_40 = 0;
            }
            pEVar11 = SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
                      ::FindEntry((SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
                                   *)local_c8,pJVar8);
            if (pEVar11 == (EntryType *)0x0) {
              JsUtil::
              List<Js::JavascriptPromise_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::EnsureArray((List<Js::JavascriptPromise_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                             *)local_88,0);
              stack.list.
              super_ReadOnlyList<Js::JavascriptPromise_*,_Memory::HeapAllocator,_DefaultComparer>.
              _vptr_ReadOnlyList
              [(int)stack.list.
                    super_ReadOnlyList<Js::JavascriptPromise_*,_Memory::HeapAllocator,_DefaultComparer>
                    .buffer] = (_func_int *)pJVar8;
              stack.list.
              super_ReadOnlyList<Js::JavascriptPromise_*,_Memory::HeapAllocator,_DefaultComparer>.
              buffer._0_4_ = (int)stack.list.
                                  super_ReadOnlyList<Js::JavascriptPromise_*,_Memory::HeapAllocator,_DefaultComparer>
                                  .buffer + 1;
              SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
              ::Add((SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
                     *)local_c8,pJVar8,1);
            }
          }
        }
        bVar12 = local_32;
      } while ((local_31 != 0) &&
              ((int)stack.list.
                    super_ReadOnlyList<Js::JavascriptPromise_*,_Memory::HeapAllocator,_DefaultComparer>
                    .buffer != 0));
    }
LAB_00cf0ad4:
    SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
    ::~SimpleHashTable((SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
                        *)local_c8);
    local_88 = (undefined1  [8])visited.stats;
    if (stack.list.
        super_ReadOnlyList<Js::JavascriptPromise_*,_Memory::HeapAllocator,_DefaultComparer>.
        _vptr_ReadOnlyList != (_func_int **)0x0) {
      Memory::HeapAllocator::Free
                ((HeapAllocator *)
                 stack.list.
                 super_ReadOnlyList<Js::JavascriptPromise_*,_Memory::HeapAllocator,_DefaultComparer>
                 ._16_8_,stack.list.
                         super_ReadOnlyList<Js::JavascriptPromise_*,_Memory::HeapAllocator,_DefaultComparer>
                         ._vptr_ReadOnlyList,
                 (long)(int)stack.list.
                            super_ReadOnlyList<Js::JavascriptPromise_*,_Memory::HeapAllocator,_DefaultComparer>
                            .alloc << 3);
    }
  }
  return (bool)bVar12;
}

Assistant:

bool JavascriptPromise::WillRejectionBeUnhandled()
    {
        bool willBeUnhandled = !this->GetIsHandled();
        if (!willBeUnhandled)
        {
            // if this promise is handled, then we need to do a depth-first search over this promise's reject
            // reactions. If we find a reaction that
            //    - associated promise is "unhandled" (ie, it's never been "then'd")
            //    - AND its rejection handler is our default "thrower function"
            // then this promise results in an unhandled rejection path.

            JsUtil::Stack<JavascriptPromise*, HeapAllocator> stack(&HeapAllocator::Instance);
            SimpleHashTable<JavascriptPromise*, int, HeapAllocator> visited(&HeapAllocator::Instance);
            stack.Push(this);
            visited.Add(this, 1);

            while (!willBeUnhandled && !stack.Empty())
            {
                JavascriptPromise * curr = stack.Pop();
                {
                    JavascriptPromiseReactionList* reactions = curr->GetReactions();
                    JavascriptPromiseReactionList::Iterator it = reactions->GetIterator();
                    while (it.Next())
                    {
                        JavascriptPromiseReactionPair pair = it.Data();
                        JavascriptPromiseReaction* reaction = pair.rejectReaction;
                        Var promiseVar = reaction->GetCapabilities()->GetPromise();

                        if (VarIs<JavascriptPromise>(promiseVar))
                        {
                            JavascriptPromise* p = VarTo<JavascriptPromise>(promiseVar);
                            if (!p->GetIsHandled())
                            {
                                RecyclableObject* handler = reaction->GetHandler();
                                if (VarIs<JavascriptFunction>(handler))
                                {
                                    JavascriptFunction* func = VarTo<JavascriptFunction>(handler);
                                    FunctionInfo* functionInfo = func->GetFunctionInfo();

#ifdef DEBUG
                                    if (!func->IsCrossSiteObject())
                                    {
                                        // assert that Thrower function's FunctionInfo hasn't changed
                                        AssertMsg(func->GetScriptContext()->GetLibrary()->GetThrowerFunction()->GetFunctionInfo() == &JavascriptPromise::EntryInfo::Thrower, "unexpected FunctionInfo for thrower function!");
                                    }
#endif

                                    // If the function info is the default thrower function's function info, then assume that this is unhandled
                                    // this will work across script contexts
                                    if (functionInfo == &JavascriptPromise::EntryInfo::Thrower)
                                    {
                                        willBeUnhandled = true;
                                        break;
                                    }
                                }
                            }
                            AssertMsg(visited.HasEntry(p) == false, "Unexpected cycle in promise reaction tree!");
                            if (!visited.HasEntry(p))
                            {
                                stack.Push(p);
                                visited.Add(p, 1);
                            }
                        }
                    }
                }
            }
        }
        return willBeUnhandled;
    }